

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O1

Key_Offset_Store_Data * Key_Offset_Store_Data::Narrow(Am_Wrapper *value)

{
  int iVar1;
  
  if ((value != (Am_Wrapper *)0x0) &&
     (iVar1 = (**(value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(),
     (Am_ID_Tag)iVar1 == id)) {
    return (Key_Offset_Store_Data *)value;
  }
  return (Key_Offset_Store_Data *)0x0;
}

Assistant:

inline void
modify_value(Am_Value &value, int offset, float multiplier)
{
  switch (value.type) {
  case Am_INT:
  case Am_LONG:
    value.value.long_value =
        (long)(value.value.long_value * multiplier) + offset;
    break;
  case Am_FLOAT:
    value.value.float_value = (value.value.float_value * multiplier) + offset;
    break;
  case Am_DOUBLE: {
    double d_value = value;
    d_value = (d_value * multiplier) + offset;
    value = d_value;
    break;
  }
  default:
    break;
  }
}